

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pattern.h
# Opt level: O2

double ZXing::IsPattern<false,3,3>
                 (PatternView *view,FixedPattern<3,_3,_false> *pattern,int spaceInPixel,
                 double minQuietZone,double moduleSizeRef)

{
  ushort *puVar1;
  value_type *pvVar2;
  int iVar3;
  int x;
  long lVar4;
  double dVar5;
  double dVar6;
  
  iVar3 = PatternView::sum(view,3);
  dVar6 = (double)iVar3 / 3.0;
  if (((minQuietZone == 0.0) && (!NAN(minQuietZone))) ||
     (minQuietZone * dVar6 + -1.0 <= (double)spaceInPixel)) {
    dVar5 = (double)(~-(ulong)(moduleSizeRef != 0.0) & (ulong)dVar6 |
                    (ulong)moduleSizeRef & -(ulong)(moduleSizeRef != 0.0));
    lVar4 = 0;
    do {
      if (lVar4 == 3) {
        return dVar6;
      }
      puVar1 = view->_data + lVar4;
      pvVar2 = pattern->_data + lVar4;
      lVar4 = lVar4 + 1;
    } while (ABS((double)*puVar1 - (double)*pvVar2 * dVar5) <= dVar5 * 0.5 + 0.5);
  }
  return 0.0;
}

Assistant:

double IsPattern(const PatternView& view, const FixedPattern<LEN, SUM, false>& pattern, int spaceInPixel = 0,
				double minQuietZone = 0, double moduleSizeRef = 0)
{
	if constexpr (E2E) {
		auto widths = BarAndSpaceSum<LEN, double>(view.data());
		auto sums = pattern.sums();
		BarAndSpace<double> modSize = {widths[0] / sums[0], widths[1] / sums[1]};

		auto [m, M] = std::minmax(modSize[0], modSize[1]);
		if (M > 4 * m) // make sure module sizes of bars and spaces are not too far away from each other
			return 0;

		if (minQuietZone && spaceInPixel < minQuietZone * modSize.space)
			return 0;

		const BarAndSpace<double> thr = {modSize[0] * .75 + .5, modSize[1] / (2 + (LEN < 6)) + .5};

		for (int x = 0; x < LEN; ++x)
			if (std::abs(view[x] - pattern[x] * modSize[x]) > thr[x])
				return 0;

		return (modSize[0] + modSize[1]) / 2;
	}

	double width = view.sum(LEN);
	if (SUM > LEN && width < SUM)
		return 0;

	const auto moduleSize = width / SUM;

	if (minQuietZone && spaceInPixel < minQuietZone * moduleSize - 1)
		return 0;

	if (!moduleSizeRef)
		moduleSizeRef = moduleSize;

	// the offset of 0.5 is to make the code less sensitive to quantization errors for small (near 1) module sizes.
	// TODO: review once we have upsampling in the binarizer in place.
	const auto threshold = moduleSizeRef * (0.5 + E2E * 0.25) + 0.5;

	for (int x = 0; x < LEN; ++x)
		if (std::abs(view[x] - pattern[x] * moduleSizeRef) > threshold)
			return 0;

	return moduleSize;
}